

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O1

void * MRIStepCreate(ARKRhsFn fse,ARKRhsFn fsi,realtype t0,N_Vector y0,MRIStepInnerStepper stepper,
                    SUNContext sunctx)

{
  MRIStepInnerStepper_Ops p_Var1;
  undefined4 in_EAX;
  int iVar2;
  ARKodeMem ark_mem_00;
  undefined8 *__s;
  SUNNonlinearSolver NLS;
  char *pcVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ARKodeMem ark_mem;
  ARKodeMem local_68;
  realtype local_60;
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  
  auVar4._0_4_ = -(uint)((int)fse == 0);
  auVar4._4_4_ = -(uint)((int)((ulong)fse >> 0x20) == 0);
  auVar4._8_4_ = -(uint)((int)fsi == 0);
  auVar4._12_4_ = -(uint)((int)((ulong)fsi >> 0x20) == 0);
  auVar5._4_4_ = auVar4._0_4_;
  auVar5._0_4_ = auVar4._4_4_;
  auVar5._8_4_ = auVar4._12_4_;
  auVar5._12_4_ = auVar4._8_4_;
  iVar2 = movmskpd(in_EAX,auVar5 & auVar4);
  if (iVar2 == 3) {
    pcVar3 = "Must specify at least one of fe, fi (both NULL).";
  }
  else if (y0 == (N_Vector)0x0) {
    pcVar3 = "y0 = NULL illegal.";
  }
  else if (stepper == (MRIStepInnerStepper)0x0) {
    pcVar3 = "The inner stepper memory is NULL";
  }
  else if (sunctx == (SUNContext)0x0) {
    pcVar3 = "sunctx = NULL illegal.";
  }
  else {
    local_60 = t0;
    local_58 = auVar5 & auVar4;
    local_48 = fse;
    uStack_40 = fsi;
    iVar2 = mriStep_CheckNVector(y0);
    if (iVar2 != 0) {
      ark_mem_00 = arkCreate(sunctx);
      if (ark_mem_00 == (ARKodeMem)0x0) {
        pcVar3 = "arkode_mem = NULL illegal.";
        iVar2 = -0x15;
        local_68 = (ARKodeMem)0x0;
        goto LAB_004f4084;
      }
      local_68 = ark_mem_00;
      __s = (undefined8 *)malloc(0x1a8);
      if (__s == (undefined8 *)0x0) {
        pcVar3 = "Allocation of arkode_mem failed.";
LAB_004f40d7:
        arkProcessError(ark_mem_00,-0x14,"ARKode::MRIStep","MRIStepCreate",pcVar3);
      }
      else {
        memset(__s,0,0x1a8);
        ark_mem_00->step_attachlinsol = mriStep_AttachLinsol;
        ark_mem_00->step_disablelsetup = mriStep_DisableLSetup;
        ark_mem_00->step_getlinmem = mriStep_GetLmem;
        ark_mem_00->step_getimplicitrhs = mriStep_GetImplicitRHS;
        ark_mem_00->step_getgammas = mriStep_GetGammas;
        ark_mem_00->step_init = mriStep_Init;
        ark_mem_00->step_fullrhs = mriStep_FullRHS;
        ark_mem_00->step = mriStep_TakeStep;
        ark_mem_00->step_mem = __s;
        iVar2 = MRIStepSetDefaults(ark_mem_00);
        if (iVar2 == 0) {
          *__s = fse;
          __s[1] = fsi;
          __s[3] = ~(CONCAT44(-(uint)((int)uStack_40 == 0),-(uint)((int)local_48 == 0)) &
                    CONCAT44(-(uint)(uStack_40._4_4_ == 0),-(uint)(local_48._4_4_ == 0))) &
                   (ulong)DAT_0078d5b0;
          local_68->lrw = local_68->lrw + 10;
          local_68->liw = local_68->liw + 0x2a;
          __s[0x12] = 0;
          *(undefined4 *)(__s + 0x13) = 0;
          if ((local_58 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            NLS = SUNNonlinSol_Newton(y0,local_68->sunctx);
            if (NLS == (SUNNonlinearSolver)0x0) {
              pcVar3 = "Error creating default Newton solver";
              ark_mem_00 = local_68;
              goto LAB_004f40d7;
            }
            iVar2 = MRIStepSetNonlinearSolver(local_68,NLS);
            if (iVar2 != 0) {
              pcVar3 = "Error attaching default Newton solver";
              iVar2 = -0x14;
              goto LAB_004f4012;
            }
            *(undefined4 *)(__s + 0x13) = 1;
          }
          __s[0x21] = 0;
          *(undefined1 (*) [16])(__s + 0x25) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])(__s + 0x27) = (undefined1  [16])0x0;
          __s[0x29] = 0;
          *(undefined1 (*) [16])(__s + 0x2b) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])(__s + 0x2d) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])(__s + 0x2f) = (undefined1  [16])0x0;
          __s[0x31] = 0;
          *(undefined1 (*) [16])(__s + 0x33) = (undefined1  [16])0x0;
          iVar2 = arkInit(local_68,local_60,y0,0);
          if (iVar2 == 0) {
            __s[0x2a] = stepper;
            p_Var1 = stepper->ops;
            if (((p_Var1 != (MRIStepInnerStepper_Ops)0x0) &&
                (p_Var1->evolve != (MRIStepInnerEvolveFn)0x0)) &&
               (p_Var1->fullrhs != (MRIStepInnerFullRhsFn)0x0)) {
              return local_68;
            }
            pcVar3 = "A required inner stepper function is NULL";
            iVar2 = -0x16;
          }
          else {
            pcVar3 = "Unable to initialize main ARKode infrastructure";
          }
        }
        else {
          pcVar3 = "Error setting default solver options";
        }
LAB_004f4012:
        arkProcessError(local_68,iVar2,"ARKode::MRIStep","MRIStepCreate",pcVar3);
      }
      MRIStepFree(&local_68);
      return (void *)0x0;
    }
    pcVar3 = "A required vector operation is not implemented.";
  }
  iVar2 = -0x16;
LAB_004f4084:
  arkProcessError((ARKodeMem)0x0,iVar2,"ARKode::MRIStep","MRIStepCreate",pcVar3);
  return (void *)0x0;
}

Assistant:

void* MRIStepCreate(ARKRhsFn fse, ARKRhsFn fsi, realtype t0, N_Vector y0,
                    MRIStepInnerStepper stepper, SUNContext sunctx)
{
  ARKodeMem          ark_mem;         /* outer ARKode memory   */
  ARKodeMRIStepMem   step_mem;        /* outer stepper memory  */
  SUNNonlinearSolver NLS;             /* default nonlin solver */
  booleantype        nvectorOK;
  int                retval;

  /* Check that at least one of fse, fsi is supplied and is to be used*/
  if (fse == NULL && fsi == NULL) {
    arkProcessError(NULL, ARK_ILL_INPUT, "ARKode::MRIStep",
                    "MRIStepCreate", MSG_ARK_NULL_F);
    return(NULL);
  }

  /* Check that y0 is supplied */
  if (y0 == NULL) {
    arkProcessError(NULL, ARK_ILL_INPUT, "ARKode::MRIStep",
                    "MRIStepCreate", MSG_ARK_NULL_Y0);
    return(NULL);
  }

  /* Check that stepper is supplied */
  if (stepper == NULL) {
    arkProcessError(NULL, ARK_ILL_INPUT, "ARKode::MRIStep",
                    "MRIStepCreate",
                    "The inner stepper memory is NULL");
    return(NULL);
  }

  /* Check that context is supplied */
  if (!sunctx) {
    arkProcessError(NULL, ARK_ILL_INPUT, "ARKode::MRIStep",
                    "MRIStepCreate", MSG_ARK_NULL_SUNCTX);
    return(NULL);
  }

  /* Test if all required vector operations are implemented */
  nvectorOK = mriStep_CheckNVector(y0);
  if (!nvectorOK) {
    arkProcessError(NULL, ARK_ILL_INPUT, "ARKode::MRIStep",
                    "MRIStepCreate", MSG_ARK_BAD_NVECTOR);
    return(NULL);
  }

  /* Create ark_mem structure and set default values */
  ark_mem = arkCreate(sunctx);
  if (ark_mem == NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode::MRIStep",
                    "MRIStepCreate", MSG_ARK_NO_MEM);
    return(NULL);
  }

  /* Allocate ARKodeMRIStepMem structure, and initialize to zero */
  step_mem = NULL;
  step_mem = (ARKodeMRIStepMem) malloc(sizeof(struct ARKodeMRIStepMemRec));
  if (step_mem == NULL) {
    arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::MRIStep",
                    "MRIStepCreate", MSG_ARK_ARKMEM_FAIL);
    MRIStepFree((void**) &ark_mem);  return(NULL);
  }
  memset(step_mem, 0, sizeof(struct ARKodeMRIStepMemRec));

  /* Attach step_mem structure and function pointers to ark_mem */
  ark_mem->step_attachlinsol   = mriStep_AttachLinsol;
  ark_mem->step_disablelsetup  = mriStep_DisableLSetup;
  ark_mem->step_getlinmem      = mriStep_GetLmem;
  ark_mem->step_getimplicitrhs = mriStep_GetImplicitRHS;
  ark_mem->step_getgammas      = mriStep_GetGammas;
  ark_mem->step_init           = mriStep_Init;
  ark_mem->step_fullrhs        = mriStep_FullRHS;
  ark_mem->step                = mriStep_TakeStep;
  ark_mem->step_mem            = (void*) step_mem;

  /* Set default values for MRIStep optional inputs */
  retval = MRIStepSetDefaults((void *) ark_mem);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, retval, "ARKode::MRIStep",
                    "MRIStepCreate",
                    "Error setting default solver options");
    MRIStepFree((void**) &ark_mem);  return(NULL);
  }

  /* Allocate the general MRI stepper vectors using y0 as a template */
  /* NOTE: Fse, Fsi, inner_forcing, cvals, Xvecs, sdata, zpred and zcor will
     be allocated later on (based on the MRI method) */

  /* Copy the slow RHS functions into stepper memory */
  step_mem->fse = fse;
  step_mem->fsi = fsi;

  /* Set implicit/explicit problem based on function pointers */
  step_mem->explicit_rhs = (fse == NULL) ? SUNFALSE : SUNTRUE;
  step_mem->implicit_rhs = (fsi == NULL) ? SUNFALSE : SUNTRUE;

  /* Update the ARKode workspace requirements */
  ark_mem->liw += 42;  /* fcn/data ptr, int, long int, sunindextype, booleantype */
  ark_mem->lrw += 10;

  /* Create a default Newton NLS object (just in case; will be deleted if
     the user attaches a nonlinear solver) */
  step_mem->NLS    = NULL;
  step_mem->ownNLS = SUNFALSE;

  if (step_mem->implicit_rhs) {
    NLS = SUNNonlinSol_Newton(y0, ark_mem->sunctx);
    if (!NLS) {
      arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::MRIStep",
                      "MRIStepCreate", "Error creating default Newton solver");
      MRIStepFree((void**) &ark_mem);  return(NULL);
    }
    retval = MRIStepSetNonlinearSolver(ark_mem, NLS);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::MRIStep",
                      "MRIStepCreate", "Error attaching default Newton solver");
      MRIStepFree((void**) &ark_mem);  return(NULL);
    }
    step_mem->ownNLS = SUNTRUE;
  }

  /* Set the linear solver addresses to NULL (we check != NULL later) */
  step_mem->linit  = NULL;
  step_mem->lsetup = NULL;
  step_mem->lsolve = NULL;
  step_mem->lfree  = NULL;
  step_mem->lmem   = NULL;

  /* Initialize all the counters */
  step_mem->nfse      = 0;
  step_mem->nfsi      = 0;
  step_mem->nsetups   = 0;
  step_mem->nstlp     = 0;
  step_mem->nls_iters = 0;
  step_mem->nls_fails = 0;

  /* Initialize fused op work space */
  step_mem->cvals        = NULL;
  step_mem->Xvecs        = NULL;

  /* Initialize pre and post inner evolve functions */
  step_mem->pre_inner_evolve  = NULL;
  step_mem->post_inner_evolve = NULL;

  /* Initialize main ARKode infrastructure (allocates vectors) */
  retval = arkInit(ark_mem, t0, y0, FIRST_INIT);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, retval, "ARKode::MRIStep", "MRIStepCreate",
                    "Unable to initialize main ARKode infrastructure");
    MRIStepFree((void**) &ark_mem);  return(NULL);
  }

  /* Attach the inner stepper memory */
  step_mem->stepper = stepper;

  /* Check for required stepper functions */
  retval = mriStepInnerStepper_HasRequiredOps(step_mem->stepper);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::MRIStep",
                    "MRIStepCreate",
                    "A required inner stepper function is NULL");
    MRIStepFree((void**) &ark_mem);
    return(NULL);
  }

  /* return ARKode memory */
  return((void*) ark_mem);
}